

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O0

Seq<rc::gen::detail::Recipe> __thiscall
rc::
makeSeq<rc::seq::detail::MapcatSeq<rc::gen::detail::shrinkRecipe(rc::gen::detail::Recipe_const&)::__0,unsigned_long>,rc::Seq<unsigned_long>,rc::gen::detail::shrinkRecipe(rc::gen::detail::Recipe_const&)::__0>
          (rc *this,Seq<unsigned_long> *args,anon_class_128_1_696a46cc_for_m_mapper *args_1)

{
  SeqImpl<rc::seq::detail::MapcatSeq<rc::gen::detail::shrinkRecipe(rc::gen::detail::Recipe_const&)::__0,unsigned_long>>
  *this_00;
  anon_class_128_1_696a46cc_for_m_mapper *args_local_1;
  Seq<unsigned_long> *args_local;
  SeqT *seq;
  
  Seq<rc::gen::detail::Recipe>::Seq((Seq<rc::gen::detail::Recipe> *)this);
  this_00 = (SeqImpl<rc::seq::detail::MapcatSeq<rc::gen::detail::shrinkRecipe(rc::gen::detail::Recipe_const&)::__0,unsigned_long>>
             *)operator_new(0x98);
  Seq<rc::gen::detail::Recipe>::
  SeqImpl<rc::seq::detail::MapcatSeq<rc::gen::detail::shrinkRecipe(rc::gen::detail::Recipe_const&)::$_0,unsigned_long>>
  ::
  SeqImpl<rc::Seq<unsigned_long>,rc::gen::detail::shrinkRecipe(rc::gen::detail::Recipe_const&)::__0>
            (this_00,args,args_1);
  std::
  unique_ptr<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl,_std::default_delete<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl>_>
  ::reset((unique_ptr<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl,_std::default_delete<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl>_>
           *)this,(pointer)this_00);
  return (unique_ptr<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl,_std::default_delete<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl>_>
          )(unique_ptr<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl,_std::default_delete<rc::Seq<rc::gen::detail::Recipe>::ISeqImpl>_>
            )this;
}

Assistant:

Seq<typename rc::compat::return_type<Impl>::type::ValueType> makeSeq(Args &&... args) {
  using SeqT = Seq<typename rc::compat::return_type<Impl>::type::ValueType>;
  using ImplT = typename SeqT::template SeqImpl<Impl>;

  SeqT seq;
  seq.m_impl.reset(new ImplT(std::forward<Args>(args)...));
  return seq;
}